

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

DnsHashEntry * __thiscall
BinHash<DnsHashEntry>::Retrieve(BinHash<DnsHashEntry> *this,DnsHashEntry *key)

{
  bool bVar1;
  uint32_t uVar2;
  byte local_31;
  DnsHashEntry *pDStack_20;
  uint32_t hash_index;
  DnsHashEntry *ret;
  DnsHashEntry *key_local;
  BinHash<DnsHashEntry> *this_local;
  
  pDStack_20 = (DnsHashEntry *)0x0;
  if ((key != (DnsHashEntry *)0x0) && (this->tableSize != 0)) {
    uVar2 = DnsHashEntry::Hash(key);
    pDStack_20 = this->hashBin[uVar2 % this->tableSize];
    while( true ) {
      local_31 = 0;
      if (pDStack_20 != (DnsHashEntry *)0x0) {
        bVar1 = DnsHashEntry::IsSameKey(key,pDStack_20);
        local_31 = bVar1 ^ 0xff;
      }
      if ((local_31 & 1) == 0) break;
      pDStack_20 = pDStack_20->HashNext;
    }
  }
  return pDStack_20;
}

Assistant:

KeyObj * Retrieve(KeyObj * key)
    {
        KeyObj * ret = 0;

        if (key != 0 && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;

            ret = hashBin[hash_index];

            while (ret != NULL && !key->IsSameKey(ret))
            {
                ret = ret->HashNext;
            }
        }

        return ret;
    }